

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

time_t msdosToUnixTime(uint32_t m)

{
  time_t tVar1;
  undefined1 local_40 [8];
  tm t;
  
  t.tm_mday = (m >> 0x19) + 0x50;
  t.tm_hour = (m >> 0x15 & 0xf) - 1;
  t.tm_min = m >> 0x10 & 0x1f;
  t.tm_sec = m >> 0xb & 0x1f;
  local_40._4_4_ = m >> 5 & 0x3f;
  local_40._0_4_ = m * 2 & 0x3e;
  t.tm_wday = -1;
  tVar1 = mktime((tm *)local_40);
  return tVar1;
}

Assistant:

time_t msdosToUnixTime(uint32_t m)
{
    struct tm t;
    t.tm_year = (m >> 25) + 80;
    t.tm_mon = ((m >> 21) & 0xf) - 1;
    t.tm_mday = (m >> 16) & 0x1f;
    t.tm_hour = (m >> 11) & 0x1f;
    t.tm_min = (m >> 5) & 0x3f;
    t.tm_sec = (m & 0x1f) << 1;
    t.tm_isdst = -1;
    return mktime(&t);
}